

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32_t tag,CodedOutputStream *output)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  undefined4 uVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  byte *pbVar9;
  int64_t iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint8_t *puVar14;
  uint32_t uVar15;
  ulong uVar16;
  ulong uVar17;
  pair<unsigned_long,_bool> pVar18;
  string temp;
  string local_50;
  
  if (tag < 8) {
    return false;
  }
  bVar8 = false;
  switch(tag & 7) {
  case 0:
    pcVar3 = *(char **)input;
    if ((pcVar3 < *(char **)(input + 8)) && (uVar16 = (ulong)*pcVar3, -1 < (long)uVar16)) {
      *(char **)input = pcVar3 + 1;
    }
    else {
      pVar18 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar18.first;
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    uVar15 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar15 | 0x80;
        tag = uVar15 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = tag;
      } while (bVar8);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    uVar17 = uVar16;
    if (0x7f < uVar16) {
      do {
        *pbVar9 = (byte)uVar17 | 0x80;
        uVar16 = uVar17 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar17;
        uVar17 = uVar16;
      } while (bVar8);
    }
    *pbVar9 = (byte)uVar16;
    pbVar9 = pbVar9 + 1;
    break;
  case 1:
    puVar4 = *(undefined8 **)input;
    if (*(int *)(input + 8) - (int)puVar4 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64_t *)&local_50);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)*puVar4;
      *(undefined8 **)input = puVar4 + 1;
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    _Var7._M_p = local_50._M_dataplus._M_p;
    uVar15 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar15 | 0x80;
        tag = uVar15 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = tag;
      } while (bVar8);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    *(pointer *)pbVar9 = _Var7._M_p;
    pbVar9 = pbVar9 + 8;
    break;
  case 2:
    pbVar9 = *(byte **)input;
    if (pbVar9 < *(byte **)(input + 8)) {
      bVar1 = *pbVar9;
      uVar15 = (uint32_t)bVar1;
      uVar11 = (uint)bVar1;
      if (-1 < (char)bVar1) {
        *(byte **)input = pbVar9 + 1;
        goto LAB_001756a4;
      }
    }
    else {
      uVar15 = 0;
    }
    iVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar15);
    uVar11 = (uint)iVar10;
    if (iVar10 < 0) {
      return false;
    }
LAB_001756a4:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    uVar15 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar15 | 0x80;
        tag = uVar15 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = tag;
      } while (bVar8);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    if (uVar11 < 0x80) {
      uVar16 = (ulong)uVar11;
    }
    else {
      uVar16 = (ulong)uVar11;
      do {
        uVar12 = (uint)uVar16;
        *pbVar9 = (byte)uVar16 | 0x80;
        uVar16 = uVar16 >> 7;
        pbVar9 = pbVar9 + 1;
      } while (0x3fff < uVar12);
    }
    *pbVar9 = (byte)uVar16;
    output->cur_ = pbVar9 + 1;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar8 = io::CodedInputStream::ReadString(input,&local_50,uVar11);
    if (bVar8) {
      puVar14 = output->cur_;
      lVar13 = (long)(int)local_50._M_string_length;
      if ((long)(output->impl_).end_ - (long)puVar14 < lVar13) {
        puVar14 = io::EpsCopyOutputStream::WriteRawFallback
                            (&output->impl_,local_50._M_dataplus._M_p,(int)local_50._M_string_length
                             ,puVar14);
      }
      else {
        memcpy(puVar14,local_50._M_dataplus._M_p,local_50._M_string_length & 0xffffffff);
        puVar14 = puVar14 + lVar13;
      }
      output->cur_ = puVar14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return bVar8;
    }
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
    return bVar8;
  case 3:
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    uVar11 = tag;
    uVar15 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar15 | 0x80;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar11 = uVar15 >> 7;
        uVar15 = uVar15 >> 7;
      } while (bVar8);
    }
    *pbVar9 = (byte)uVar11;
    output->cur_ = pbVar9 + 1;
    iVar2 = *(int *)(input + 0x34);
    *(int *)(input + 0x34) = iVar2 + -1;
    if (iVar2 < 1) {
      return false;
    }
    bVar8 = SkipMessage(input,output);
    if (!bVar8) {
      return false;
    }
    if (*(int *)(input + 0x34) < *(int *)(input + 0x38)) {
      *(int *)(input + 0x34) = *(int *)(input + 0x34) + 1;
    }
    return *(uint *)(input + 0x20) == (tag & 0xfffffff8 | 4);
  default:
    goto switchD_0017544a_caseD_4;
  case 5:
    puVar5 = *(undefined4 **)input;
    if (*(int *)(input + 8) - (int)puVar5 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32_t *)&local_50);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *puVar5;
      *(undefined4 **)input = puVar5 + 1;
    }
    pbVar9 = output->cur_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    uVar15 = tag;
    if (0x7f < tag) {
      do {
        *pbVar9 = (byte)uVar15 | 0x80;
        tag = uVar15 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar8 = 0x3fff < uVar15;
        uVar15 = tag;
      } while (bVar8);
    }
    *pbVar9 = (byte)tag;
    pbVar9 = pbVar9 + 1;
    output->cur_ = pbVar9;
    uVar6 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar9) {
      pbVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar9);
    }
    *(undefined4 *)pbVar9 = uVar6;
    pbVar9 = pbVar9 + 4;
  }
  output->cur_ = pbVar9;
  bVar8 = true;
switchD_0017544a_caseD_4:
  return bVar8;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO: Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}